

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

uint GetBlockScriptFlags(CBlockIndex *block_index,ChainstateManager *chainman)

{
  long lVar1;
  CChainParams *pCVar2;
  _Rb_tree_color _Var3;
  int iVar4;
  _Rb_tree_color _Var5;
  uint256 **ppuVar6;
  const_iterator cVar7;
  uint uVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = (chainman->m_options).chainparams;
  ppuVar6 = inline_assertion_check<true,uint256_const*const&>
                      (&block_index->phashBlock,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                       ,0x943,"GetBlockScriptFlags","block_index.phashBlock");
  cVar7 = std::
          _Rb_tree<uint256,_std::pair<const_uint256,_unsigned_int>,_std::_Select1st<std::pair<const_uint256,_unsigned_int>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
          ::find(&(pCVar2->consensus).script_flag_exceptions._M_t,*ppuVar6);
  if ((_Rb_tree_header *)cVar7._M_node ==
      &(pCVar2->consensus).script_flag_exceptions._M_t._M_impl.super__Rb_tree_header) {
    _Var5 = 0x20801;
  }
  else {
    _Var5 = cVar7._M_node[2]._M_color;
  }
  pCVar2 = (chainman->m_options).chainparams;
  iVar4 = block_index->nHeight;
  auVar9._0_4_ = -(uint)(iVar4 < (pCVar2->consensus).BIP65Height);
  auVar9._4_4_ = -(uint)(iVar4 < (pCVar2->consensus).BIP66Height);
  auVar9._8_4_ = -(uint)(iVar4 < (pCVar2->consensus).CSVHeight);
  auVar9._12_4_ = -(uint)(iVar4 < (pCVar2->consensus).SegwitHeight);
  uVar8 = movmskps((int)pCVar2,auVar9);
  _Var3 = _Var5 | 4;
  if ((uVar8 & 2) != 0) {
    _Var3 = _Var5;
  }
  _Var5 = _Var3 | 0x200;
  if ((uVar8 & 1) != 0) {
    _Var5 = _Var3;
  }
  _Var3 = _Var5 | 0x400;
  if ((uVar8 & 4) != 0) {
    _Var3 = _Var5;
  }
  _Var5 = _Var3 | 0x10;
  if ((uVar8 & 8) != 0) {
    _Var5 = _Var3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return _Var5;
  }
  __stack_chk_fail();
}

Assistant:

static unsigned int GetBlockScriptFlags(const CBlockIndex& block_index, const ChainstateManager& chainman)
{
    const Consensus::Params& consensusparams = chainman.GetConsensus();

    // BIP16 didn't become active until Apr 1 2012 (on mainnet, and
    // retroactively applied to testnet)
    // However, only one historical block violated the P2SH rules (on both
    // mainnet and testnet).
    // Similarly, only one historical block violated the TAPROOT rules on
    // mainnet.
    // For simplicity, always leave P2SH+WITNESS+TAPROOT on except for the two
    // violating blocks.
    uint32_t flags{SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_TAPROOT};
    const auto it{consensusparams.script_flag_exceptions.find(*Assert(block_index.phashBlock))};
    if (it != consensusparams.script_flag_exceptions.end()) {
        flags = it->second;
    }

    // Enforce the DERSIG (BIP66) rule
    if (DeploymentActiveAt(block_index, chainman, Consensus::DEPLOYMENT_DERSIG)) {
        flags |= SCRIPT_VERIFY_DERSIG;
    }

    // Enforce CHECKLOCKTIMEVERIFY (BIP65)
    if (DeploymentActiveAt(block_index, chainman, Consensus::DEPLOYMENT_CLTV)) {
        flags |= SCRIPT_VERIFY_CHECKLOCKTIMEVERIFY;
    }

    // Enforce CHECKSEQUENCEVERIFY (BIP112)
    if (DeploymentActiveAt(block_index, chainman, Consensus::DEPLOYMENT_CSV)) {
        flags |= SCRIPT_VERIFY_CHECKSEQUENCEVERIFY;
    }

    // Enforce BIP147 NULLDUMMY (activated simultaneously with segwit)
    if (DeploymentActiveAt(block_index, chainman, Consensus::DEPLOYMENT_SEGWIT)) {
        flags |= SCRIPT_VERIFY_NULLDUMMY;
    }

    return flags;
}